

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOrderDfs(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupOrderDfs_rec(pNew,p,pGVar4);
  }
  iVar5 = 0;
  do {
    iVar2 = p->vCis->nSize;
    if (iVar2 <= iVar5) {
LAB_001d378e:
      if (pNew->vCis->nSize == iVar2) {
        Gia_ManDupRemapCis(pNew,p);
        Gia_ManDupRemapEquiv(pNew,p);
        Gia_ManSetRegNum(pNew,p->nRegs);
        return pNew;
      }
      __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0xd9,"Gia_Man_t *Gia_ManDupOrderDfs(Gia_Man_t *)");
    }
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->vCis->nSize;
      goto LAB_001d378e;
    }
    if (pGVar4->Value == 0xffffffff) {
      uVar1 = Gia_ManAppendCi(pNew);
      pGVar4->Value = uVar1;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManForEachCi( p, pObj, i )
        if ( !~pObj->Value )
            pObj->Value = Gia_ManAppendCi(pNew);
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManDupRemapCis( pNew, p );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}